

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptNativeFloatArray::Push(ScriptContext *scriptContext,Var array,double value)

{
  uint index;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JavascriptArray *arr;
  Var pvVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  ulong uVar8;
  double value_00;
  Var local_48;
  Var args [2];
  
  args[1] = (Var)value;
  bVar2 = VarIs<Js::JavascriptNativeFloatArray>(array);
  if ((!bVar2) || (*array != VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address))
  goto LAB_00b870ef;
  arr = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeFloatArray>(array);
  bVar2 = JavascriptArray::HasAnyES5ArrayInPrototypeChain(arr,true);
  if (bVar2) {
    local_48 = array;
    args[0] = JavascriptNumber::ToVarNoCheck((double)args[1],scriptContext);
    pvVar4 = JavascriptArray::EntryPushNonJavascriptArray(scriptContext,&local_48,2);
LAB_00b870e9:
    bVar2 = false;
  }
  else {
    iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(arr);
    if (iVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x147b,"(!nativeFloatArray->IsCrossSiteObject())",
                                  "!nativeFloatArray->IsCrossSiteObject()");
      if (!bVar2) goto LAB_00b87126;
      *puVar5 = 0;
    }
    index = (arr->super_ArrayObject).length;
    if ((ulong)index != 0xffffffff) {
      SetItem((JavascriptNativeFloatArray *)arr,index,(double)args[1]);
      uVar8 = (ulong)index + 1;
      if ((Type)uVar8 != (arr->super_ArrayObject).length) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1481,"(n == nativeFloatArray->length)",
                                    "Wrong update to the length of the native Float array");
        if (!bVar2) goto LAB_00b87126;
        *puVar5 = 0;
      }
      if ((int)(Type)uVar8 < 0) {
        value_00 = (double)(uVar8 & 0xffffffff);
        uVar6 = NumberUtilities::ToSpecial(value_00);
        bVar2 = NumberUtilities::IsNan(value_00);
        if (bVar2) {
          uVar7 = NumberUtilities::ToSpecial(value_00);
          if (uVar7 != 0xfff8000000000000) {
            uVar7 = NumberUtilities::ToSpecial(value_00);
            if (uVar7 != 0x7ff8000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar2) {
LAB_00b87126:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar5 = 0;
            }
          }
        }
        pvVar4 = (Var)(uVar6 ^ 0xfffc000000000000);
      }
      else {
        pvVar4 = (Var)(uVar8 | 0x1000000000000);
      }
      goto LAB_00b870e9;
    }
    bVar2 = true;
    pvVar4 = (Var)0xffffffff;
  }
  if (!bVar2) {
    return pvVar4;
  }
LAB_00b870ef:
  pvVar4 = JavascriptNumber::ToVarNoCheck((double)args[1],scriptContext);
  pvVar4 = JavascriptArray::Push(scriptContext,array,pvVar4);
  return pvVar4;
}

Assistant:

Var JavascriptNativeFloatArray::Push(ScriptContext * scriptContext, Var array, double value)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_NativeFloatPush);
        JIT_HELPER_SAME_ATTRIBUTES(Array_NativeFloatPush, Array_VarPush);

        // Fast path for case where `array` is a same-site JavascriptNativeFloatArray
        // instance with a length less than MaxArrayLength
        if (VarIs<JavascriptNativeFloatArray>(array) &&
            VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(array))
        {
            auto* nativeFloatArray = UnsafeVarTo<JavascriptNativeFloatArray>(array);
            if (JavascriptArray::HasAnyES5ArrayInPrototypeChain(nativeFloatArray, true))
            {
                Var args[2];
                args[0] = array;
                args[1] = JavascriptNumber::ToVarNoCheck(value, scriptContext);

                return EntryPushNonJavascriptArray(scriptContext, args, 2);
            }
            Assert(!nativeFloatArray->IsCrossSiteObject());
            uint32 n = nativeFloatArray->length;
            if( n < JavascriptArray::MaxArrayLength)
            {
                nativeFloatArray->SetItem(n, value);
                n++;
                AssertMsg(n == nativeFloatArray->length, "Wrong update to the length of the native Float array");
                return JavascriptNumber::ToVar(n, scriptContext);
            }
        }

        return JavascriptArray::Push(scriptContext, array, JavascriptNumber::ToVarNoCheck(value, scriptContext));

        JIT_HELPER_END(Array_NativeFloatPush);
    }